

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_part_file.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::posix_part_file::posix_part_file
          (posix_part_file *this,string *path,string *name,int num_pieces,int piece_size)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int32_t val;
  strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void> sVar5;
  char *pcVar6;
  size_type __n;
  FILE *__stream;
  char *pcVar7;
  int *piVar8;
  error_category *cat;
  mapped_type *pmVar9;
  reference rVar10;
  reference local_100;
  strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void> local_f0;
  int local_ec;
  slot_index_t i_1;
  strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void> local_cc;
  strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void> local_c8;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_c4;
  slot_index_t slot;
  bool local_b9;
  piece_index_t i;
  vector<bool,_slot_index_t> free_slots;
  int piece_size_;
  int num_pieces_;
  char *ptr;
  size_t n;
  undefined1 local_70 [8];
  vector<char,_std::allocator<char>_> header;
  undefined1 local_50 [8];
  file_pointer f;
  error_code ec;
  int piece_size_local;
  int num_pieces_local;
  string *name_local;
  string *path_local;
  posix_part_file *this_local;
  
  ::std::__cxx11::string::string((string *)this,(string *)path);
  ::std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  ::std::
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
  ::vector(&this->m_free_slots);
  strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>::strong_typedef
            (&this->m_num_allocated,0);
  this->m_max_pieces = num_pieces;
  this->m_piece_size = piece_size;
  iVar2 = anon_unknown.dwarf_8c9dff::round_up(num_pieces * 4 + 8);
  this->m_header_size = iVar2;
  this->m_dirty_metadata = false;
  ::std::
  unordered_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>_>
  ::unordered_map(&this->m_piece_map);
  boost::system::error_code::error_code((error_code *)&f);
  open_file((posix_part_file *)local_50,(open_mode)this,(error_code *)0x0);
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)&f);
  if (bVar1) {
    header.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 1;
  }
  else {
    iVar2 = this->m_header_size;
    ::std::allocator<char>::allocator();
    ::std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_70,(long)iVar2,
               (allocator_type *)((long)&n + 7));
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&n + 7));
    pcVar6 = ::std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_70);
    __n = ::std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)local_70);
    __stream = (FILE *)file_pointer::file((file_pointer *)local_50);
    pcVar6 = (char *)fread(pcVar6,1,__n,__stream);
    ptr = pcVar6;
    pcVar7 = (char *)::std::vector<char,_std::allocator<char>_>::size
                               ((vector<char,_std::allocator<char>_> *)local_70);
    if (pcVar6 == pcVar7) {
      if (ptr < (char *)(long)this->m_header_size) {
        header.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 1;
      }
      else {
        _piece_size_ = ::std::vector<char,_std::allocator<char>_>::data
                                 ((vector<char,_std::allocator<char>_> *)local_70);
        uVar3 = read_uint32<char*>((char **)&piece_size_);
        uVar4 = read_uint32<char*>((char **)&piece_size_);
        if ((num_pieces == uVar3) && (this->m_piece_size == uVar4)) {
          container_wrapper<bool,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::vector<bool,_std::allocator<bool>_>_>
          ::container_wrapper((container_wrapper<bool,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::vector<bool,_std::allocator<bool>_>_>
                               *)&i);
          local_b9 = true;
          container_wrapper<bool,libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>,std::vector<bool,std::allocator<bool>>>
          ::resize<int,void>((container_wrapper<bool,libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>,std::vector<bool,std::allocator<bool>>>
                              *)&i,num_pieces,&local_b9);
          memset(&slot,0,4);
          while( true ) {
            strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
                      (&local_c4,num_pieces);
            bVar1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator<
                              ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)&slot,
                               &local_c4);
            if (!bVar1) break;
            val = read_int32<char*>((char **)&piece_size_);
            strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>::strong_typedef
                      (&local_c8,val);
            iVar2 = strong_typedef::operator_cast_to_int((strong_typedef *)&local_c8);
            if (-1 < iVar2) {
              strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>::strong_typedef
                        (&local_cc,num_pieces);
              bVar1 = strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>::operator>=
                                (&local_c8,&local_cc);
              if (!bVar1) {
                bVar1 = strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>::operator>=
                                  (&local_c8,&this->m_num_allocated);
                if (bVar1) {
                  sVar5 = next<int,libtorrent::aux::slot_index_tag_t>(local_c8);
                  (this->m_num_allocated).m_val = sVar5.m_val;
                }
                local_ec = local_c8.m_val;
                rVar10 = container_wrapper<bool,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::vector<bool,_std::allocator<bool>_>_>
                         ::operator[]((container_wrapper<bool,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::vector<bool,_std::allocator<bool>_>_>
                                       *)&i,local_c8);
                _i_1 = rVar10._M_p;
                ::std::_Bit_reference::operator=((_Bit_reference *)&i_1,false);
                pmVar9 = ::std::
                         unordered_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>_>
                         ::operator[](&this->m_piece_map,(key_type *)&slot);
                pmVar9->m_val = local_c8.m_val;
              }
            }
            strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator++
                      ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)&slot);
          }
          memset(&local_f0,0,4);
          while( true ) {
            bVar1 = strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>::operator<
                              (&local_f0,&this->m_num_allocated);
            if (!bVar1) break;
            rVar10 = container_wrapper<bool,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::vector<bool,_std::allocator<bool>_>_>
                     ::operator[]((container_wrapper<bool,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::vector<bool,_std::allocator<bool>_>_>
                                   *)&i,local_f0);
            local_100 = rVar10;
            bVar1 = ::std::_Bit_reference::operator_cast_to_bool(&local_100);
            if (bVar1) {
              ::std::
              vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
              ::push_back(&this->m_free_slots,&local_f0);
            }
            strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>::operator++(&local_f0);
          }
          container_wrapper<bool,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::vector<bool,_std::allocator<bool>_>_>
          ::~container_wrapper
                    ((container_wrapper<bool,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::vector<bool,_std::allocator<bool>_>_>
                      *)&i);
          header.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
        }
        else {
          header.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 1;
        }
      }
    }
    else {
      piVar8 = __errno_location();
      iVar2 = *piVar8;
      cat = boost::system::generic_category();
      boost::system::error_code::assign((error_code *)&f,iVar2,cat);
      header.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 1;
    }
    ::std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_70);
  }
  file_pointer::~file_pointer((file_pointer *)local_50);
  return;
}

Assistant:

posix_part_file::posix_part_file(std::string path, std::string name
		, int const num_pieces, int const piece_size)
		: m_path(std::move(path))
		, m_name(std::move(name))
		, m_max_pieces(num_pieces)
		, m_piece_size(piece_size)
		, m_header_size(round_up((2 + num_pieces) * 4))
	{
		TORRENT_ASSERT(num_pieces > 0);
		TORRENT_ASSERT(m_piece_size > 0);

		error_code ec;
		auto f = open_file(open_mode::read_only, ec);
		if (ec) return;

		// parse header
		std::vector<char> header(static_cast<std::size_t>(m_header_size));
		auto const n = std::fread(header.data(), 1, header.size(), f.file());
		if (std::size_t(n) != header.size())
		{
			ec.assign(errno, generic_category());
			return;
		}

		// we don't have a full header. consider the file empty
		if (n < std::size_t(m_header_size)) return;
		using namespace libtorrent::aux;

		char* ptr = header.data();
		// we have a header. Parse it
		int const num_pieces_ = int(read_uint32(ptr));
		int const piece_size_ = int(read_uint32(ptr));

		// if there is a mismatch in number of pieces or piece size
		// consider the file empty and overwrite anything in there
		if (num_pieces != num_pieces_ || m_piece_size != piece_size_) return;

		// this is used to determine which slots are free, and how many
		// slots are allocated
		aux::vector<bool, slot_index_t> free_slots;
		free_slots.resize(num_pieces, true);

		for (auto i = piece_index_t(0); i < piece_index_t(num_pieces); ++i)
		{
			slot_index_t const slot(read_int32(ptr));
			if (static_cast<int>(slot) < 0) continue;

			// invalid part-file
			TORRENT_ASSERT(slot < slot_index_t(num_pieces));
			if (slot >= slot_index_t(num_pieces)) continue;

			if (slot >= m_num_allocated)
				m_num_allocated = next(slot);

			free_slots[slot] = false;
			m_piece_map[i] = slot;
		}

		// now, populate the free_list with the "holes"
		for (slot_index_t i(0); i < m_num_allocated; ++i)
		{
			if (free_slots[i]) m_free_slots.push_back(i);
		}
	}